

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

int Bac_ManExtract_rec(Gia_Man_t *pNew,Bac_Ntk_t *p,int i,int fBuffers,Vec_Int_t *vMap)

{
  byte bVar1;
  Bac_ObjType_t BVar2;
  char *pcVar3;
  Bac_Man_t *pBVar4;
  void **ppvVar5;
  Dec_Graph_t *pFForm;
  Bac_ObjType_t BVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint i_00;
  Bac_Ntk_t *pBVar12;
  bool bVar13;
  int pLits [16];
  Vec_Int_t Leaves;
  
  if ((i < 0) || ((p->vCopy).nSize <= i)) goto LAB_0030722c;
  BVar2 = (p->vCopy).pArray[(uint)i];
  if (-1 < (int)BVar2) {
    return BVar2;
  }
  iVar10 = (p->vType).nSize;
  if (iVar10 <= i) {
LAB_0030724b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  pcVar3 = (p->vType).pArray;
  bVar1 = pcVar3[(uint)i];
  if ((bVar1 & 0xfc) == 4) {
    if ((p->vFanin).nSize <= i) goto LAB_0030722c;
    pLits[0] = Bac_ManExtract_rec(pNew,p,(p->vFanin).pArray[(uint)i],fBuffers,vMap);
    goto LAB_00306e69;
  }
  if ((bVar1 & 0xfe) != 8) {
    if ((bVar1 & 0xfe) != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                    ,0xd4,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
    iVar10 = p->iBoxNtk;
    if (((long)iVar10 < 1) || (p->pDesign->nNtks < iVar10)) {
      pBVar12 = (Bac_Ntk_t *)0x0;
    }
    else {
      pBVar12 = p->pDesign->pNtks + iVar10;
    }
    if (9 < bVar1) goto LAB_003072e6;
    if ((p->vIndex).nSize <= i) goto LAB_0030722c;
    uVar11 = p->iBoxObj;
    if (((int)uVar11 < 0) || ((pBVar12->vType).nSize <= (int)uVar11)) goto LAB_0030724b;
    if (((byte)(pBVar12->vType).pArray[uVar11] >> 1) - 0x49 < 0xffffffbc) {
LAB_0030726a:
      __assert_fail("Bac_ObjIsBox(p, b)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                    ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
    }
    iVar10 = ~(p->vIndex).pArray[(uint)i] + uVar11;
    pLits[0] = Bac_ManExtract_rec(pNew,pBVar12,iVar10,fBuffers,vMap);
    if (fBuffers != 0) {
      pBVar4 = p->pDesign;
      iVar7 = (int)((ulong)((long)p - (long)pBVar4->pNtks) >> 4) * -0x3b13b13b;
      if ((iVar7 < 1) || (pBVar4->nNtks < iVar7)) {
LAB_00307289:
        __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                      ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
      }
      iVar9 = (int)((ulong)((long)pBVar12 - (long)pBVar12->pDesign->pNtks) >> 4) * -0x3b13b13b;
      if ((iVar9 < 1) || (pBVar12->pDesign->nNtks < iVar9)) goto LAB_00307289;
      pLits[0] = Bac_ManAddBarbuf(pNew,pLits[0],pBVar4,iVar7,i,iVar9,iVar10,vMap);
    }
    goto LAB_00306e69;
  }
  if (9 < bVar1) {
LAB_003072e6:
    __assert_fail("Bac_ObjIsCio(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                  ,0x11e,"int Bac_ObjIndex(Bac_Ntk_t *, int)");
  }
  if ((p->vIndex).nSize <= i) goto LAB_0030722c;
  uVar11 = (p->vIndex).pArray[(uint)i];
  i_00 = ~uVar11 + i;
  if (((int)i_00 < 0) || (iVar10 <= (int)i_00)) goto LAB_0030724b;
  if ((pcVar3[i_00] & 0xfeU) == 10) {
    if ((p->vFanin).nSize <= (int)i_00) goto LAB_0030722c;
    iVar10 = (p->vFanin).pArray[i_00];
    if (((long)iVar10 < 1) || (p->pDesign->nNtks < iVar10)) {
      pBVar12 = (Bac_Ntk_t *)0x0;
    }
    else {
      pBVar12 = p->pDesign->pNtks + iVar10;
    }
    if (((int)uVar11 < 0) || ((pBVar12->vOutputs).nSize <= (int)uVar11)) goto LAB_0030722c;
    iVar10 = (pBVar12->vOutputs).pArray[uVar11];
    pLits[0] = Bac_ManExtract_rec(pNew,pBVar12,iVar10,fBuffers,vMap);
    bVar13 = true;
    BVar6 = pLits[0];
    if (fBuffers != 0) {
      pBVar4 = p->pDesign;
      iVar7 = (int)((ulong)((long)p - (long)pBVar4->pNtks) >> 4) * -0x3b13b13b;
      if ((iVar7 < 1) || (pBVar4->nNtks < iVar7)) goto LAB_00307289;
      iVar9 = (int)((ulong)((long)pBVar12 - (long)pBVar12->pDesign->pNtks) >> 4) * -0x3b13b13b;
      if ((iVar9 < 1) || (pBVar12->pDesign->nNtks < iVar9)) goto LAB_00307289;
      pLits[0] = Bac_ManAddBarbuf(pNew,pLits[0],pBVar4,iVar7,i,iVar9,iVar10,vMap);
      bVar13 = true;
      BVar6 = pLits[0];
    }
    goto LAB_00307219;
  }
  iVar10 = Bac_ObjIsBoxPrim(p,i_00);
  if (iVar10 == 0) {
    __assert_fail("Bac_ObjIsBoxPrim(p, iBox)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                  ,0x8a,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
  }
  if ((int)i_00 < 1) {
    uVar8 = 0;
  }
  else {
    uVar11 = i_00 - 1;
    uVar8 = 0;
    do {
      iVar10 = (p->vType).nSize;
      if (iVar10 <= (int)uVar11) goto LAB_0030724b;
      pcVar3 = (p->vType).pArray;
      if ((pcVar3[uVar11] & 0xfeU) != 6) break;
      if (iVar10 <= (int)i_00) goto LAB_0030724b;
      if (((byte)pcVar3[i_00] >> 1) - 0x49 < 0xffffffbc) goto LAB_0030726a;
      if ((p->vFanin).nSize <= (int)uVar11) goto LAB_0030722c;
      iVar10 = Bac_ManExtract_rec(pNew,p,(p->vFanin).pArray[uVar11],fBuffers,vMap);
      pLits[uVar8] = iVar10;
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 - 1;
    } while (-1 < (int)uVar11);
  }
  uVar11 = (uint)uVar8;
  if (0x10 < uVar11) {
    __assert_fail("nLits <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                  ,0x8d,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
  }
  ppvVar5 = p->pDesign->ppGraphs;
  bVar13 = ppvVar5 == (void **)0x0;
  if (!bVar13) {
    iVar10 = Bac_BoxNtkId(p,i_00);
    pFForm = (Dec_Graph_t *)ppvVar5[iVar10];
    Leaves.pArray = pLits;
    Leaves.nCap = uVar11;
    Leaves.nSize = uVar11;
    if (pFForm == (Dec_Graph_t *)0x0) {
      __assert_fail("pGraph != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                    ,0x93,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
    BVar6 = Gia_ManFactorGraph(pNew,pFForm,&Leaves);
    pLits[0] = BVar2;
    goto LAB_00307219;
  }
  BVar6 = Bac_ObjType(p,i_00);
  switch(uVar8 & 0xffffffff) {
  case 0:
    if (BVar6 == BAC_BOX_CF) {
      pLits[0] = BAC_OBJ_NONE;
    }
    else {
      if (BVar6 != BAC_BOX_CT) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                      ,0x9f,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      pLits[0] = BAC_OBJ_PI;
    }
    break;
  case 1:
    if (BVar6 == BAC_BOX_INV) {
      if (pLits[0] < 0) goto LAB_00307381;
      pLits[0] = pLits[0] ^ BAC_OBJ_PI;
    }
    else if (BVar6 != BAC_BOX_BUF) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                    ,0xa7,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
    break;
  case 2:
    switch(BVar6) {
    case BAC_BOX_AND:
      break;
    case BAC_BOX_NAND:
      BVar6 = Gia_ManHashAnd(pNew,pLits[0],pLits[1]);
      goto LAB_003071e9;
    case BAC_BOX_OR:
LAB_003071a2:
      pLits[0] = Gia_ManHashOr(pNew,pLits[0],pLits[1]);
      BVar6 = pLits[0];
      goto LAB_00307219;
    case BAC_BOX_NOR:
      BVar6 = Gia_ManHashOr(pNew,pLits[0],pLits[1]);
      goto LAB_003071e9;
    case BAC_BOX_XOR:
LAB_00307193:
      pLits[0] = Gia_ManHashXor(pNew,pLits[0],pLits[1]);
      BVar6 = pLits[0];
      goto LAB_00307219;
    case BAC_BOX_XNOR:
      BVar6 = Gia_ManHashXor(pNew,pLits[0],pLits[1]);
LAB_003071e9:
      if ((int)BVar6 < 0) {
LAB_00307381:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10e,"int Abc_LitNot(int)");
      }
      pLits[0] = BVar6 ^ BAC_OBJ_PI;
      goto LAB_00307219;
    case BAC_BOX_SHARP:
      if (pLits[1] < 0) goto LAB_00307381;
      pLits[1] = pLits[1] ^ 1;
      break;
    case BAC_BOX_SHARPL:
      if (pLits[0] < 0) goto LAB_00307381;
      pLits[0] = pLits[0] ^ 1;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                    ,0xbb,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
    pLits[0] = Gia_ManHashAnd(pNew,pLits[0],pLits[1]);
    BVar6 = pLits[0];
    break;
  case 3:
    if (BVar6 == BAC_BOX_ADD) {
      uVar11 = Gia_ManHashAnd(pNew,pLits[1],pLits[2]);
      iVar10 = Gia_ManHashOr(pNew,pLits[1],pLits[2]);
      iVar7 = Bac_BoxBoNum(p,i_00);
      if (iVar7 != 2) {
        __assert_fail("Bac_BoxBoNum(p, iBox) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                      ,199,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                     );
      }
      iVar7 = Bac_BoxBo(p,i_00,0);
      if (iVar7 == i) {
        if ((int)uVar11 < 0) goto LAB_00307381;
        pLits[1] = Gia_ManHashAnd(pNew,uVar11 ^ 1,iVar10);
        goto LAB_00307193;
      }
      iVar7 = Bac_BoxBo(p,i_00,1);
      if (iVar7 != i) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                      ,0xcc,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      pLits[1] = Gia_ManHashAnd(pNew,pLits[0],iVar10);
      pLits[0] = uVar11;
      goto LAB_003071a2;
    }
    if (BVar6 == BAC_BOX_MAJ) {
      pLits[0] = Gia_ManHashMaj(pNew,pLits[0],pLits[1],pLits[2]);
      BVar6 = pLits[0];
    }
    else {
      if (BVar6 != BAC_BOX_MUX) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                      ,0xce,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      pLits[0] = Gia_ManHashMux(pNew,pLits[0],pLits[1],pLits[2]);
      BVar6 = pLits[0];
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacBlast.c"
                  ,0xd0,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
  }
LAB_00307219:
  if (bVar13) {
LAB_00306e69:
    BVar6 = pLits[0];
    if ((p->vCopy).nSize <= i) {
LAB_0030722c:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vCopy).pArray[(uint)i] != -1) {
      __assert_fail("Bac_ObjCopy(p, i) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                    ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
    }
    Vec_IntFillExtra(&p->vCopy,i + 1,0);
    if ((p->vCopy).nSize <= i) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (p->vCopy).pArray[(uint)i] = BVar6;
  }
  return BVar6;
}

Assistant:

int Bac_ManExtract_rec( Gia_Man_t * pNew, Bac_Ntk_t * p, int i, int fBuffers, Vec_Int_t * vMap )
{
    int iRes = Bac_ObjCopy( p, i );
    if ( iRes >= 0 )
        return iRes;
    if ( Bac_ObjIsCo(p, i) )
        iRes = Bac_ManExtract_rec( pNew, p, Bac_ObjFanin(p, i), fBuffers, vMap );
    else if ( Bac_ObjIsPi(p, i) )
    {
        Bac_Ntk_t * pHost = Bac_NtkHostNtk( p );
        int iObj = Bac_BoxBi( pHost, Bac_NtkHostObj(p), Bac_ObjIndex(p, i) );
        iRes = Bac_ManExtract_rec( pNew, pHost, iObj, fBuffers, vMap );
        if ( fBuffers )
            iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pHost), iObj, vMap );
    }
    else if ( Bac_ObjIsBo(p, i) )
    {
        int iBox = Bac_BoxBoBox(p, i);
        if ( Bac_ObjIsBoxUser(p, iBox) ) // user box
        {
            Bac_Ntk_t * pBox = Bac_BoxBoNtk( p, i );
            int iObj = Bac_NtkPo( pBox, Bac_ObjIndex(p, i) );
            iRes = Bac_ManExtract_rec( pNew, pBox, iObj, fBuffers, vMap );
            if ( fBuffers )
                iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pBox), iObj, vMap );
        }
        else // primitive
        {
            int iFanin, nLits, pLits[16];
            assert( Bac_ObjIsBoxPrim(p, iBox) );
            Bac_BoxForEachFanin( p, iBox, iFanin, nLits )
                pLits[nLits] = Bac_ManExtract_rec( pNew, p, iFanin, fBuffers, vMap );
            assert( nLits <= 16 );
            if ( p->pDesign->ppGraphs ) // mapped gate
            {
                extern int Gia_ManFactorGraph( Gia_Man_t * p, Dec_Graph_t * pFForm, Vec_Int_t * vLeaves );
                Dec_Graph_t * pGraph = (Dec_Graph_t *)p->pDesign->ppGraphs[Bac_BoxNtkId(p, iBox)];
                Vec_Int_t Leaves = { nLits, nLits, pLits };
                assert( pGraph != NULL );
                return Gia_ManFactorGraph( pNew, pGraph, &Leaves );
            }
            else
            {
                Bac_ObjType_t Type = Bac_ObjType(p, iBox);
                if ( nLits == 0 )
                {
                    if ( Type == BAC_BOX_CF )
                        iRes = 0;
                    else if ( Type == BAC_BOX_CT )
                        iRes = 1;
                    else assert( 0 );
                }
                else if ( nLits == 1 )
                {
                    if ( Type == BAC_BOX_BUF )
                        iRes = pLits[0];
                    else if ( Type == BAC_BOX_INV )
                        iRes = Abc_LitNot( pLits[0] );
                    else assert( 0 );
                }
                else if ( nLits == 2 )
                {
                    if ( Type == BAC_BOX_AND )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NAND )
                        iRes = Abc_LitNot( Gia_ManHashAnd( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_OR )
                        iRes = Gia_ManHashOr( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NOR )
                        iRes = Abc_LitNot( Gia_ManHashOr( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_XOR )
                        iRes = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_XNOR )
                        iRes = Abc_LitNot( Gia_ManHashXor( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_SHARP )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], Abc_LitNot(pLits[1]) );
                    else if ( Type == BAC_BOX_SHARPL )
                        iRes = Gia_ManHashAnd( pNew, Abc_LitNot(pLits[0]), pLits[1] );
                    else assert( 0 );
                }
                else if ( nLits == 3 )
                {
                    if ( Type == BAC_BOX_MUX )
                        iRes = Gia_ManHashMux( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_MAJ )
                        iRes = Gia_ManHashMaj( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_ADD )
                    {
                        int iRes0 = Gia_ManHashAnd( pNew, pLits[1], pLits[2] );
                        int iRes1 = Gia_ManHashOr( pNew, pLits[1], pLits[2] );
                        assert( Bac_BoxBoNum(p, iBox) == 2 );
                        if ( Bac_BoxBo(p, iBox, 0) == i ) // sum
                            iRes = Gia_ManHashXor( pNew, pLits[0], Gia_ManHashAnd(pNew, Abc_LitNot(iRes0), iRes1) );
                        else if ( Bac_BoxBo(p, iBox, 1) == i ) // cout
                            iRes = Gia_ManHashOr( pNew, iRes0, Gia_ManHashAnd(pNew, pLits[0], iRes1) );
                        else assert( 0 );
                    }
                    else assert( 0 );
                }
                else assert( 0 );
            }
        }
    }
    else assert( 0 );
    Bac_ObjSetCopy( p, i, iRes );
    return iRes;
}